

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O1

bool __thiscall flatbuffers::dart::DartGenerator::generate(DartGenerator *this)

{
  _Rb_tree_node_base *suffix;
  _Rb_tree_header *p_Var1;
  Parser *pPVar2;
  size_t __n;
  _Base_ptr __n_00;
  bool bVar3;
  int iVar4;
  _Base_ptr p_Var5;
  undefined8 *puVar6;
  long *plVar7;
  _Rb_tree_node_base *p_Var8;
  DartGenerator *pDVar9;
  size_type *psVar10;
  ulong *puVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong uVar13;
  undefined8 uVar14;
  string *included;
  pointer pIVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string import_code;
  namespace_code_map namespace_code;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  imports;
  bool local_1a1;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  DartGenerator *local_160;
  char *local_158;
  size_t local_150;
  char local_148;
  undefined7 uStack_147;
  ulong *local_138;
  long local_130;
  ulong local_128;
  long lStack_120;
  undefined1 local_118 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  long local_e8;
  size_type local_e0;
  long lStack_d8;
  string local_d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_158 = &local_148;
  local_150 = 0;
  local_148 = '\0';
  local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._M_impl.super__Rb_tree_header._M_header;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  GenerateEnums(this,(namespace_code_map *)&local_b0);
  GenerateStructs(this,(namespace_code_map *)&local_b0);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_160 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  Parser::GetIncludedFiles
            ((vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> *)
             local_118,(this->super_BaseGenerator).parser_);
  if (local_118._0_8_ != local_118._8_8_) {
    pDVar9 = local_160;
    included = (string *)(local_118._0_8_ + 0x20);
    do {
      pPVar2 = (pDVar9->super_BaseGenerator).parser_;
      __n = included->_M_string_length;
      if ((__n != (pPVar2->file_being_parsed_)._M_string_length) ||
         ((__n != 0 &&
          (iVar4 = bcmp((included->_M_dataplus)._M_p,(pPVar2->file_being_parsed_)._M_dataplus._M_p,
                        __n), pDVar9 = local_160, iVar4 != 0)))) {
        import_generator<flatbuffers::StructDef>
                  (local_160,&(pPVar2->structs_).vec,included,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_60);
        import_generator<flatbuffers::EnumDef>
                  (local_160,&(((local_160->super_BaseGenerator).parser_)->enums_).vec,included,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_60);
        pDVar9 = local_160;
      }
      pIVar15 = (pointer)(included + 1);
      included = included + 2;
    } while (pIVar15 != (pointer)local_118._8_8_);
  }
  std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>::~vector
            ((vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> *)
             local_118);
  local_118._0_8_ = local_118 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"","");
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::__cxx11::string::_M_append(local_118,*(ulong *)(p_Var5 + 1));
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  std::__cxx11::string::append(local_118);
  local_1a1 = (_Rb_tree_header *)local_b0._M_impl.super__Rb_tree_header._M_header._M_left ==
              &local_b0._M_impl.super__Rb_tree_header;
  if (!local_1a1) {
    p_Var5 = local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      paVar12 = &local_180.field_2;
      local_150 = 0;
      *local_158 = '\0';
      local_138 = &local_128;
      std::__cxx11::string::_M_construct<char*>((string *)&local_138,local_158,local_158);
      std::__cxx11::string::append((char *)&local_138);
      BaseGenerator::FlatBuffersGeneratedWarning();
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_180.field_2._M_allocated_capacity = *psVar10;
        local_180.field_2._8_8_ = puVar6[3];
        local_180._M_dataplus._M_p = (pointer)paVar12;
      }
      else {
        local_180.field_2._M_allocated_capacity = *psVar10;
        local_180._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_180._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_180);
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_1a0.field_2._M_allocated_capacity = *psVar10;
        local_1a0.field_2._8_8_ = plVar7[3];
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      }
      else {
        local_1a0.field_2._M_allocated_capacity = *psVar10;
        local_1a0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_1a0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_158,(string *)&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != paVar12) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138,local_128 + 1);
      }
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a0,local_158,local_158 + local_150);
      std::__cxx11::string::append((char *)&local_1a0);
      std::__cxx11::string::operator=((string *)&local_158,(string *)&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      local_f8._M_allocated_capacity = (size_type)(p_Var5 + 1);
      if (p_Var5[1]._M_parent != (_Base_ptr)0x0) {
        std::operator+(&local_180,"library ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_f8._M_allocated_capacity);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_180);
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        psVar10 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_1a0.field_2._M_allocated_capacity = *psVar10;
          local_1a0.field_2._8_8_ = plVar7[3];
        }
        else {
          local_1a0.field_2._M_allocated_capacity = *psVar10;
          local_1a0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_1a0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_1a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != paVar12) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)&local_158);
      std::operator+(&local_180,"import \'package:flat_buffers/flat_buffers.dart\' as ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_kFb_abi_cxx11_);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_180);
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_1a0.field_2._M_allocated_capacity = *psVar10;
        local_1a0.field_2._8_8_ = plVar7[3];
      }
      else {
        local_1a0.field_2._M_allocated_capacity = *psVar10;
        local_1a0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_1a0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_1a0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      p_Var8 = local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != paVar12) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        p_Var8 = local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      for (; (_Rb_tree_header *)p_Var8 != &local_b0._M_impl.super__Rb_tree_header;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        suffix = p_Var8 + 1;
        __n_00 = p_Var8[1]._M_parent;
        if ((__n_00 != p_Var5[1]._M_parent) ||
           ((__n_00 != (_Base_ptr)0x0 &&
            (iVar4 = bcmp(*(void **)suffix,*(void **)local_f8._M_allocated_capacity,(size_t)__n_00),
            iVar4 != 0)))) {
          Filename(&local_80,local_160,(string *)suffix,false);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x36f358);
          local_f8._8_8_ = &local_e0;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((size_type *)*plVar7 == psVar10) {
            local_e0 = *psVar10;
            lStack_d8 = plVar7[3];
          }
          else {
            local_e0 = *psVar10;
            local_f8._8_8_ = (size_type *)*plVar7;
          }
          local_e8 = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append(local_f8._M_local_buf + 8);
          puVar11 = (ulong *)(plVar7 + 2);
          if ((ulong *)*plVar7 == puVar11) {
            local_128 = *puVar11;
            lStack_120 = plVar7[3];
            local_138 = &local_128;
          }
          else {
            local_128 = *puVar11;
            local_138 = (ulong *)*plVar7;
          }
          local_130 = plVar7[1];
          *plVar7 = (long)puVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          ImportAliasName(&local_d0,(string *)suffix);
          uVar13 = 0xf;
          if (local_138 != &local_128) {
            uVar13 = local_128;
          }
          if (uVar13 < local_d0._M_string_length + local_130) {
            uVar14 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&local_d0 + 0x10U)) {
              uVar14 = local_d0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar14 < local_d0._M_string_length + local_130) goto LAB_001cb5d6;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_138);
          }
          else {
LAB_001cb5d6:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_138,(ulong)local_d0._M_dataplus._M_p);
          }
          psVar10 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_180.field_2._M_allocated_capacity = *psVar10;
            local_180.field_2._8_8_ = puVar6[3];
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          }
          else {
            local_180.field_2._M_allocated_capacity = *psVar10;
            local_180._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_180._M_string_length = puVar6[1];
          *puVar6 = psVar10;
          puVar6[1] = 0;
          *(undefined1 *)psVar10 = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_180);
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_1a0.field_2._M_allocated_capacity = *psVar10;
            local_1a0.field_2._8_8_ = plVar7[3];
          }
          else {
            local_1a0.field_2._M_allocated_capacity = *psVar10;
            local_1a0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_1a0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_1a0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)&local_d0 + 0x10U)) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if (local_138 != &local_128) {
            operator_delete(local_138,local_128 + 1);
          }
          if ((size_type *)local_f8._8_8_ != &local_e0) {
            operator_delete((void *)local_f8._8_8_,local_e0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
      }
      std::__cxx11::string::append((char *)&local_158);
      std::__cxx11::string::_M_append((char *)&local_158,local_118._0_8_);
      std::__cxx11::string::_M_append((char *)&local_158,*(ulong *)(p_Var5 + 2));
      Filename(&local_1a0,local_160,(string *)local_f8._M_allocated_capacity,true);
      bVar3 = SaveFile(local_1a0._M_dataplus._M_p,local_158,local_150,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) break;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      local_1a1 = (_Rb_tree_header *)p_Var5 == &local_b0._M_impl.super__Rb_tree_header;
    } while (!local_1a1);
  }
  if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
    operator_delete((void *)local_118._0_8_,
                    (ulong)((long)&(((string *)local_118._16_8_)->_M_dataplus)._M_p + 1));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_b0);
  if (local_158 != &local_148) {
    operator_delete(local_158,CONCAT71(uStack_147,local_148) + 1);
  }
  return local_1a1;
}

Assistant:

bool generate() {
    std::string code;
    namespace_code_map namespace_code;
    GenerateEnums(namespace_code);
    GenerateStructs(namespace_code);

    std::set<std::string> imports;

    for (const auto &included_file : parser_.GetIncludedFiles()) {
      if (included_file.filename == parser_.file_being_parsed_) continue;

      import_generator(parser_.structs_.vec, included_file.filename, imports);
      import_generator(parser_.enums_.vec, included_file.filename, imports);
    }

    std::string import_code = "";
    for (const auto &file : imports) { import_code += file; }

    import_code += import_code.empty() ? "" : "\n";

    for (auto kv = namespace_code.begin(); kv != namespace_code.end(); ++kv) {
      code.clear();
      code = code + "// " + FlatBuffersGeneratedWarning() + "\n";
      code = code +
             "// ignore_for_file: unused_import, unused_field, unused_element, "
             "unused_local_variable\n\n";

      if (!kv->first.empty()) { code += "library " + kv->first + ";\n\n"; }

      code += "import 'dart:typed_data' show Uint8List;\n";
      code += "import 'package:flat_buffers/flat_buffers.dart' as " + _kFb +
              ";\n\n";

      for (auto kv2 = namespace_code.begin(); kv2 != namespace_code.end();
           ++kv2) {
        if (kv2->first != kv->first) {
          code += "import './" + Filename(kv2->first, /*path=*/false) +
                  "' as " + ImportAliasName(kv2->first) + ";\n";
        }
      }

      code += "\n";
      code += import_code;

      code += kv->second;

      if (!SaveFile(Filename(kv->first).c_str(), code, false)) { return false; }
    }
    return true;
  }